

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall enact::Lexer::Lexer(Lexer *this,string *source)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>_>
  __l;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  *local_5c0;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>_>
  local_597;
  key_equal local_596;
  hasher local_595;
  TokenType local_594 [34];
  TokenType local_50c;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  *local_508;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_500;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_4d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_4b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_488;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_460;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_438;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_410;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_3e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_3c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_398;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_348;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_2f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_2a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_280;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_50;
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  string *source_local;
  Lexer *this_local;
  
  local_18 = (undefined1  [8])source;
  source_local = &this->m_source;
  std::__cxx11::string::string((string *)this,(string *)source);
  this->m_current = 0;
  this->m_line = 1;
  this->m_col = 0;
  Token::Token(&this->m_last);
  this->m_currentInterpolations = 0;
  local_508 = &local_500;
  local_50c = AND;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[4],_enact::TokenType,_true>(local_508,(char (*) [4])"and",&local_50c);
  local_508 = &local_4d8;
  local_594[0x1d] = 0x28;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(local_508,(char (*) [3])"as",local_594 + 0x1d);
  local_508 = &local_4b0;
  local_594[0x1c] = 0x29;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[6],_enact::TokenType,_true>
            (local_508,(char (*) [6])"assoc",local_594 + 0x1c);
  local_508 = &local_488;
  local_594[0x1b] = 0x2a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[6],_enact::TokenType,_true>
            (local_508,(char (*) [6])"break",local_594 + 0x1b);
  local_508 = &local_460;
  local_594[0x1a] = 0x2b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>(local_508,(char (*) [5])"case",local_594 + 0x1a)
  ;
  local_508 = &local_438;
  local_594[0x19] = 0x2c;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[9],_enact::TokenType,_true>
            (local_508,(char (*) [9])"continue",local_594 + 0x19);
  local_508 = &local_410;
  local_594[0x18] = 0x2d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[8],_enact::TokenType,_true>
            (local_508,(char (*) [8])"default",local_594 + 0x18);
  local_508 = &local_3e8;
  local_594[0x17] = 0x2e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>(local_508,(char (*) [5])"else",local_594 + 0x17)
  ;
  local_508 = &local_3c0;
  local_594[0x16] = 0x2f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>(local_508,(char (*) [5])"enum",local_594 + 0x16)
  ;
  local_508 = &local_398;
  local_594[0x15] = 0x30;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[6],_enact::TokenType,_true>
            (local_508,(char (*) [6])"false",local_594 + 0x15);
  local_508 = &local_370;
  local_594[0x14] = 0x32;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>(local_508,(char (*) [5])"func",local_594 + 0x14)
  ;
  local_508 = &local_348;
  local_594[0x13] = 0x33;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[4],_enact::TokenType,_true>(local_508,(char (*) [4])"for",local_594 + 0x13);
  local_508 = &local_320;
  local_594[0x12] = 0x31;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>
            (local_508,(char (*) [3])0x143222,local_594 + 0x12);
  local_508 = &local_2f8;
  local_594[0x11] = 0x34;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(local_508,(char (*) [3])"if",local_594 + 0x11);
  local_508 = &local_2d0;
  local_594[0x10] = 0x35;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[4],_enact::TokenType,_true>(local_508,(char (*) [4])"imm",local_594 + 0x10);
  local_508 = &local_2a8;
  local_594[0xf] = 0x36;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>(local_508,(char (*) [5])"impl",local_594 + 0xf);
  local_508 = &local_280;
  local_594[0xe] = 0x37;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(local_508,(char (*) [3])"in",local_594 + 0xe);
  local_508 = &local_258;
  local_594[0xd] = 0x38;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(local_508,(char (*) [3])"is",local_594 + 0xd);
  local_508 = &local_230;
  local_594[0xc] = 0x39;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[4],_enact::TokenType,_true>(local_508,(char (*) [4])"mut",local_594 + 0xc);
  local_508 = &local_208;
  local_594[0xb] = 0x3a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[4],_enact::TokenType,_true>(local_508,(char (*) [4])"not",local_594 + 0xb);
  local_508 = &local_1e0;
  local_594[10] = 0x3b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(local_508,(char (*) [3])0x144317,local_594 + 10)
  ;
  local_508 = &local_1b8;
  local_594[9] = 0x3c;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[4],_enact::TokenType,_true>(local_508,(char (*) [4])"pub",local_594 + 9);
  local_508 = &local_190;
  local_594[8] = 0x3d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(local_508,(char (*) [3])"rc",local_594 + 8);
  local_508 = &local_168;
  local_594[7] = 0x3e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[7],_enact::TokenType,_true>(local_508,(char (*) [7])"return",local_594 + 7);
  local_508 = &local_140;
  local_594[6] = 0x3f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(local_508,(char (*) [3])"so",local_594 + 6);
  local_508 = &local_118;
  local_594[5] = 0x40;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[7],_enact::TokenType,_true>(local_508,(char (*) [7])"struct",local_594 + 5);
  local_508 = &local_f0;
  local_594[4] = 0x41;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[7],_enact::TokenType,_true>(local_508,(char (*) [7])"switch",local_594 + 4);
  local_508 = &local_c8;
  local_594[3] = 0x42;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[6],_enact::TokenType,_true>(local_508,(char (*) [6])"trait",local_594 + 3);
  local_508 = &local_a0;
  local_594[2] = 0x43;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>(local_508,(char (*) [5])"true",local_594 + 2);
  local_508 = &local_78;
  local_594[1] = 0x44;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>(local_508,(char (*) [5])"when",local_594 + 1);
  local_508 = &local_50;
  local_594[0] = WHILE;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[6],_enact::TokenType,_true>(local_508,(char (*) [6])"while",local_594);
  local_28 = &local_500;
  local_20 = 0x1f;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>_>
  ::allocator(&local_597);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>_>_>
  ::unordered_map(&this->m_keywords,__l,0,&local_595,&local_596,&local_597);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>_>
  ::~allocator(&local_597);
  local_5c0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
               *)&local_28;
  do {
    local_5c0 = local_5c0 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
    ::~pair(local_5c0);
  } while (local_5c0 != &local_500);
  return;
}

Assistant:

Lexer::Lexer(std::string source) : m_source{std::move(source)} {}